

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  FieldDescriptor *this_00;
  long lVar1;
  int iVar2;
  Type TVar3;
  undefined4 extraout_var;
  Descriptor *pDVar5;
  anon_union_8_8_13f84498_for_Symbol_2 aVar6;
  long lVar7;
  int i;
  long lVar8;
  Symbol SVar9;
  long lVar4;
  
  assert_mutex_held(this->builder_->pool_);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  lVar4 = CONCAT44(extraout_var,iVar2);
  SVar9 = LookupSymbolNoPlaceholder(this->builder_,name,*(string **)(lVar4 + 8),LOOKUP_ALL,true);
  aVar6 = SVar9.field_1;
  if (SVar9.type == MESSAGE) {
    if (*(char *)(*(long *)(lVar4 + 0x20) + 0x68) == '\x01') {
      lVar7 = 0;
      for (lVar8 = 0; lVar8 < *(int *)(aVar6.descriptor + 0x78); lVar8 = lVar8 + 1) {
        lVar1 = *(long *)(aVar6.descriptor + 0x80);
        if (*(long *)(lVar1 + 0x58 + lVar7) == lVar4) {
          this_00 = (FieldDescriptor *)(lVar7 + lVar1);
          TVar3 = FieldDescriptor::type(this_00);
          if (((TVar3 == TYPE_MESSAGE) && (*(int *)(lVar1 + 0x4c + lVar7) == 1)) &&
             (pDVar5 = FieldDescriptor::message_type(this_00), pDVar5 == aVar6.descriptor)) {
            return this_00;
          }
        }
        lVar7 = lVar7 + 0xa8;
      }
    }
  }
  else if ((SVar9.type == FIELD) && (aVar6.descriptor[0x50] != (Descriptor)0x0)) {
    return (FieldDescriptor *)aVar6.descriptor;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

virtual const FieldDescriptor* FindExtension(
      Message* message, const string& name) const {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result = builder_->LookupSymbolNoPlaceholder(
        name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return NULL;
  }